

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O2

int CfdGetTxCountInBlock(void *handle,void *block_handle,uint32_t *tx_count)

{
  uint32_t uVar1;
  CfdException *pCVar2;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"BlockOpe",&local_49);
  cfd::capi::CheckBuffer(block_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (tx_count == (uint32_t *)0x0) {
    local_48._0_8_ = "cfdcapi_block.cpp";
    local_48._8_4_ = 400;
    local_48._16_8_ = "CfdGetTxCountInBlock";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"tx_count is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_48,"Failed to parameter. tx_count is null.",&local_49);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(Block **)((long)block_handle + 0x18) != (Block *)0x0) {
    if (*(int *)((long)block_handle + 0x10) < 3) {
      uVar1 = cfd::core::Block::GetTransactionCount(*(Block **)((long)block_handle + 0x18));
      *tx_count = uVar1;
      return 0;
    }
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_48,"Elements is not supported.",&local_49);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_48,"Invalid handle state. block is null",&local_49);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_48);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxCountInBlock(
    void* handle, void* block_handle, uint32_t* tx_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_count == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_count is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_count is null.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      *tx_count = block_data->block->GetTransactionCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}